

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numerical_integrator.cpp
# Opt level: O3

void __thiscall
NumericalIntegrator::rungeKuttaGill
          (NumericalIntegrator *this,double current_time,VectorXd *current_state_vec,
          VectorXd *control_input_vec,double integration_length,
          Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *next_state_vec)

{
  double **ppdVar1;
  double *pdVar2;
  double dVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  VectorXd *pVVar10;
  undefined8 *puVar11;
  double *pdVar12;
  char *__function;
  double *pdVar13;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  Index index_1;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  VectorXd local_118;
  long local_108;
  double local_f8;
  VectorXd *local_f0;
  double local_d8;
  undefined8 uStack_d0;
  VectorXd local_c8;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double *local_90;
  long local_88;
  double *local_78;
  long local_70;
  double *local_60;
  long local_58;
  double *local_48;
  long local_40;
  
  local_48 = (this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
  local_40 = (this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
  if (local_40 < 0 && local_48 != (double *)0x0) {
LAB_00108eef:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  NMPCModel::stateFunc
            (&this->model_,current_time,current_state_vec,control_input_vec,
             (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_48);
  lVar18 = (this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if (lVar18 < 0) goto LAB_00108ed0;
  local_f0 = &this->k1_vec_;
  dVar21 = integration_length * 0.5;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)current_state_vec;
  local_108 = lVar18;
  local_f8 = dVar21;
  if ((current_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
      m_rows == lVar18) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&local_118);
    local_60 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
    local_58 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
    if (local_58 < 0 && local_60 != (double *)0x0) goto LAB_00108eef;
    local_d8 = dVar21 + current_time;
    NMPCModel::stateFunc
              (&this->model_,local_d8,&local_c8,control_input_vec,
               (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_60);
    free(local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    uVar4 = (this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows;
    if ((long)uVar4 < 0) goto LAB_00108ed0;
    if ((current_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
        m_storage.m_rows == uVar4) {
      uVar16 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      if ((long)uVar16 < 0) goto LAB_00108ed0;
      if (uVar4 == uVar16) {
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)0x0;
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             0;
        if (uVar4 == 0) {
          pdVar12 = (current_state_vec->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          ;
          pdVar13 = (this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          pdVar15 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          uVar16 = 0;
          dVar23 = integration_length * 0.29289321881345254;
          dVar22 = dVar21 * 0.41421356237309515;
        }
        else {
          if (0x1fffffffffffffff < uVar4) {
LAB_00108f42:
            puVar11 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar11 = std::ios::widen;
            __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          uStack_b0 = 0;
          uStack_a0 = 0;
          local_b8 = integration_length * 0.29289321881345254;
          local_a8 = dVar21 * 0.41421356237309515;
          pVVar10 = (VectorXd *)malloc(uVar4 * 8);
          if (uVar4 != 1 && ((ulong)pVVar10 & 0xf) != 0) goto LAB_00108f70;
          if (pVVar10 == (VectorXd *)0x0) goto LAB_00108f42;
          pdVar12 = (current_state_vec->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          ;
          pdVar13 = (this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          pdVar15 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          uVar16 = uVar4 & 0x1ffffffffffffffe;
          local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = (double *)pVVar10;
          dVar23 = local_b8;
          dVar22 = local_a8;
          if (uVar4 != 1) {
            uVar17 = 0;
            do {
              dVar7 = (pdVar13 + uVar17)[1];
              dVar3 = (pdVar12 + uVar17)[1];
              dVar8 = (pdVar15 + uVar17)[1];
              ppdVar1 = &(pVVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + uVar17;
              *ppdVar1 = (double *)
                         (pdVar15[uVar17] * local_b8 + pdVar13[uVar17] * local_a8 + pdVar12[uVar17])
              ;
              ppdVar1[1] = (double *)(dVar8 * local_b8 + dVar7 * local_a8 + dVar3);
              uVar17 = uVar17 + 2;
            } while (uVar17 < uVar16);
          }
        }
        for (; uVar16 != uVar4; uVar16 = uVar16 + 1) {
          (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data)->m_storage).m_data)[uVar16] =
               (double *)(pdVar15[uVar16] * dVar23 + pdVar13[uVar16] * dVar22 + pdVar12[uVar16]);
        }
        local_78 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
        local_70 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar4;
        if (local_70 < 0 && local_78 != (double *)0x0) goto LAB_00108eef;
        NMPCModel::stateFunc
                  (&this->model_,local_d8,&local_118,control_input_vec,
                   (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                   &local_78);
        free(local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        uVar4 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if ((long)uVar4 < 0) {
LAB_00108ed0:
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        if ((current_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            m_storage.m_rows != uVar4) {
          __function = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_00109017;
        }
        uVar16 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if ((long)uVar16 < 0) goto LAB_00108ed0;
        if (uVar4 != uVar16) {
          __function = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_00109017;
        }
        dVar21 = dVar21 * 1.4142135623730951;
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)0x0;
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             0;
        if (uVar4 == 0) {
          pdVar12 = (current_state_vec->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          ;
          pdVar13 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          pdVar15 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          uVar16 = 0;
          dVar23 = integration_length * 1.7071067811865475;
        }
        else {
          if (0x1fffffffffffffff < uVar4) {
LAB_00108f8f:
            puVar11 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar11 = std::ios::widen;
            __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          uStack_d0 = 0;
          local_d8 = integration_length * 1.7071067811865475;
          pVVar10 = (VectorXd *)malloc(uVar4 * 8);
          if (uVar4 != 1 && ((ulong)pVVar10 & 0xf) != 0) {
LAB_00108f70:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                          "void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (pVVar10 == (VectorXd *)0x0) goto LAB_00108f8f;
          pdVar12 = (current_state_vec->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          ;
          pdVar13 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          pdVar15 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          uVar16 = uVar4 & 0x1ffffffffffffffe;
          local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = (double *)pVVar10;
          dVar23 = local_d8;
          if (uVar4 != 1) {
            uVar17 = 0;
            do {
              dVar22 = (pdVar12 + uVar17)[1];
              dVar3 = (pdVar13 + uVar17)[1];
              dVar7 = (pdVar15 + uVar17)[1];
              ppdVar1 = &(pVVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + uVar17;
              *ppdVar1 = (double *)
                         (pdVar15[uVar17] * local_d8 + (pdVar12[uVar17] - pdVar13[uVar17] * dVar21))
              ;
              ppdVar1[1] = (double *)(dVar7 * local_d8 + (dVar22 - dVar3 * dVar21));
              uVar17 = uVar17 + 2;
            } while (uVar17 < uVar16);
          }
        }
        for (; uVar16 != uVar4; uVar16 = uVar16 + 1) {
          (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data)->m_storage).m_data)[uVar16] =
               (double *)(pdVar15[uVar16] * dVar23 + (pdVar12[uVar16] - pdVar13[uVar16] * dVar21));
        }
        local_90 = (this->k4_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
        local_88 = (this->k4_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar4;
        if (local_88 < 0 && local_90 != (double *)0x0) goto LAB_00108eef;
        NMPCModel::stateFunc
                  (&this->model_,current_time + integration_length,&local_118,control_input_vec,
                   (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                   &local_90);
        free(local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        uVar4 = (this->k2_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if ((long)uVar4 < 0) goto LAB_00108ed0;
        if ((this->k1_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows != uVar4) goto LAB_00108f0e;
        uVar16 = (this->k3_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if ((long)uVar16 < 0) goto LAB_00108ed0;
        if (uVar4 == uVar16) {
          if (uVar4 == (this->k4_vec_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows) {
            if ((current_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows == uVar4) {
              if (*(ulong *)&(next_state_vec->
                             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                             ).field_0x8 == uVar4) {
                uVar16 = *(ulong *)&next_state_vec->
                                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ;
                uVar17 = uVar4;
                if (((uVar16 & 7) == 0) &&
                   (uVar17 = (ulong)((uint)(uVar16 >> 3) & 1), uVar4 <= uVar17)) {
                  uVar17 = uVar4;
                }
                pdVar12 = (current_state_vec->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_data;
                pdVar13 = (this->k1_vec_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data;
                pdVar15 = (this->k2_vec_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data;
                pdVar5 = (this->k3_vec_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
                pdVar6 = (this->k4_vec_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
                lVar18 = uVar4 - uVar17;
                if (uVar17 != 0) {
                  uVar20 = 0;
                  do {
                    *(double *)(uVar16 + uVar20 * 8) =
                         ((pdVar5[uVar20] * 3.414213562373095 +
                           pdVar15[uVar20] * 0.5857864376269049 + pdVar13[uVar20] + pdVar6[uVar20])
                         * integration_length) / 6.0 + pdVar12[uVar20];
                    uVar20 = uVar20 + 1;
                  } while (uVar17 != uVar20);
                }
                auVar9 = _DAT_00115ad0;
                lVar14 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
                uVar20 = uVar17;
                if (1 < lVar18) {
                  do {
                    dVar21 = (pdVar12 + uVar20)[1];
                    auVar24._0_8_ =
                         (pdVar6[uVar20] +
                         pdVar5[uVar20] * 3.414213562373095 +
                         pdVar15[uVar20] * 0.5857864376269049 + pdVar13[uVar20]) *
                         integration_length;
                    auVar24._8_8_ =
                         ((pdVar6 + uVar20)[1] +
                         (pdVar5 + uVar20)[1] * 3.414213562373095 +
                         (pdVar15 + uVar20)[1] * 0.5857864376269049 + (pdVar13 + uVar20)[1]) *
                         integration_length;
                    auVar24 = divpd(auVar24,auVar9);
                    pdVar2 = (double *)(uVar16 + uVar20 * 8);
                    *pdVar2 = auVar24._0_8_ + pdVar12[uVar20];
                    pdVar2[1] = auVar24._8_8_ + dVar21;
                    uVar20 = uVar20 + 2;
                  } while ((long)uVar20 < lVar14);
                }
                if (lVar14 < (long)uVar4) {
                  lVar14 = lVar18 / 2;
                  lVar19 = 0;
                  do {
                    *(double *)(uVar16 + lVar14 * 0x10 + uVar17 * 8 + lVar19 * 8) =
                         ((pdVar5[uVar17 + lVar14 * 2 + lVar19] * 3.414213562373095 +
                           pdVar15[uVar17 + lVar14 * 2 + lVar19] * 0.5857864376269049 +
                           pdVar13[uVar17 + lVar14 * 2 + lVar19] +
                          pdVar6[uVar17 + lVar14 * 2 + lVar19]) * integration_length) / 6.0 +
                         pdVar12[uVar17 + lVar14 * 2 + lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar18 % 2 != lVar19);
                }
                return;
              }
              __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                            "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
                           );
            }
            __function = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const ..." /* TRUNCATED STRING LITERAL */
            ;
          }
          else {
            __function = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
          }
          goto LAB_00109017;
        }
      }
      __function = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
      ;
      goto LAB_00109017;
    }
  }
LAB_00108f0e:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
  ;
LAB_00109017:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

void NumericalIntegrator::rungeKuttaGill(const double current_time, const Eigen::VectorXd& current_state_vec, const Eigen::VectorXd& control_input_vec, const double integration_length, Eigen::Ref<Eigen::VectorXd> next_state_vec)
{
    model_.stateFunc(current_time, current_state_vec, control_input_vec, k1_vec_);
    model_.stateFunc(current_time+0.5*integration_length, current_state_vec+0.5*integration_length*k1_vec_, control_input_vec, k2_vec_);
    model_.stateFunc(current_time+0.5*integration_length, current_state_vec+integration_length*0.5*(std::sqrt(2)-1)*k1_vec_+integration_length*(1-(1/std::sqrt(2)))*k2_vec_, control_input_vec, k3_vec_);
    model_.stateFunc(current_time+integration_length, current_state_vec-integration_length*0.5*std::sqrt(2)*k2_vec_+integration_length*(1+(1/std::sqrt(2)))*k3_vec_, control_input_vec, k4_vec_);
    next_state_vec = current_state_vec + integration_length*(k1_vec_+(2-std::sqrt(2))*k2_vec_+(2+std::sqrt(2))*k3_vec_+k4_vec_)/6;
}